

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh8_factory.cpp
# Opt level: O3

void __thiscall embree::BVH8Factory::selectBuilders(BVH8Factory *this,int features)

{
  code *pcVar1;
  code *pcVar2;
  code *pcVar3;
  bool bVar4;
  
  bVar4 = (~features & 0x60000ffU) == 0;
  pcVar1 = BVH8Curve8vBuilder_OBB_New_error;
  if (bVar4) {
    pcVar1 = avx::BVH8Curve8vBuilder_OBB_New;
  }
  pcVar2 = BVH8OBBCurve8iMBBuilder_OBB_error;
  if (bVar4) {
    pcVar2 = avx::BVH8OBBCurve8iMBBuilder_OBB;
  }
  this->BVH8Curve8vBuilder_OBB_New = pcVar1;
  this->BVH8OBBCurve8iMBBuilder_OBB = pcVar2;
  pcVar1 = BVH8Triangle4SceneBuilderSAH_error;
  if (bVar4) {
    pcVar1 = avx::BVH8Triangle4SceneBuilderSAH;
  }
  this->BVH8Triangle4SceneBuilderSAH = pcVar1;
  pcVar1 = BVH8Triangle4vSceneBuilderSAH_error;
  if (bVar4) {
    pcVar1 = avx::BVH8Triangle4vSceneBuilderSAH;
  }
  pcVar2 = BVH8Triangle4iSceneBuilderSAH_error;
  if (bVar4) {
    pcVar2 = avx::BVH8Triangle4iSceneBuilderSAH;
  }
  pcVar3 = BVH8Triangle4iMBSceneBuilderSAH_error;
  if (bVar4) {
    pcVar3 = avx::BVH8Triangle4iMBSceneBuilderSAH;
  }
  this->BVH8Triangle4vSceneBuilderSAH = pcVar1;
  this->BVH8Triangle4iSceneBuilderSAH = pcVar2;
  this->BVH8Triangle4iMBSceneBuilderSAH = pcVar3;
  pcVar1 = BVH8Triangle4vMBSceneBuilderSAH_error;
  if (bVar4) {
    pcVar1 = avx::BVH8Triangle4vMBSceneBuilderSAH;
  }
  this->BVH8Triangle4vMBSceneBuilderSAH = pcVar1;
  pcVar1 = BVH8QuantizedTriangle4iSceneBuilderSAH_error;
  if (bVar4) {
    pcVar1 = avx::BVH8QuantizedTriangle4iSceneBuilderSAH;
  }
  pcVar2 = BVH8QuantizedTriangle4SceneBuilderSAH_error;
  if (bVar4) {
    pcVar2 = avx::BVH8QuantizedTriangle4SceneBuilderSAH;
  }
  pcVar3 = BVH8Quad4vSceneBuilderSAH_error;
  if (bVar4) {
    pcVar3 = avx::BVH8Quad4vSceneBuilderSAH;
  }
  this->BVH8QuantizedTriangle4iSceneBuilderSAH = pcVar1;
  this->BVH8QuantizedTriangle4SceneBuilderSAH = pcVar2;
  this->BVH8Quad4vSceneBuilderSAH = pcVar3;
  pcVar1 = BVH8Quad4iSceneBuilderSAH_error;
  if (bVar4) {
    pcVar1 = avx::BVH8Quad4iSceneBuilderSAH;
  }
  this->BVH8Quad4iSceneBuilderSAH = pcVar1;
  pcVar1 = BVH8Quad4iMBSceneBuilderSAH_error;
  if (bVar4) {
    pcVar1 = avx::BVH8Quad4iMBSceneBuilderSAH;
  }
  pcVar2 = BVH8QuantizedQuad4iSceneBuilderSAH_error;
  if (bVar4) {
    pcVar2 = avx::BVH8QuantizedQuad4iSceneBuilderSAH;
  }
  pcVar3 = BVH8VirtualSceneBuilderSAH_error;
  if (bVar4) {
    pcVar3 = avx::BVH8VirtualSceneBuilderSAH;
  }
  this->BVH8Quad4iMBSceneBuilderSAH = pcVar1;
  this->BVH8QuantizedQuad4iSceneBuilderSAH = pcVar2;
  this->BVH8VirtualSceneBuilderSAH = pcVar3;
  pcVar1 = BVH8VirtualMBSceneBuilderSAH_error;
  if (bVar4) {
    pcVar1 = avx::BVH8VirtualMBSceneBuilderSAH;
  }
  this->BVH8VirtualMBSceneBuilderSAH = pcVar1;
  pcVar1 = BVH8InstanceSceneBuilderSAH_error;
  if (bVar4) {
    pcVar1 = avx::BVH8InstanceSceneBuilderSAH;
  }
  pcVar2 = BVH8InstanceMBSceneBuilderSAH_error;
  if (bVar4) {
    pcVar2 = avx::BVH8InstanceMBSceneBuilderSAH;
  }
  pcVar3 = BVH8InstanceArraySceneBuilderSAH_error;
  if (bVar4) {
    pcVar3 = avx::BVH8InstanceArraySceneBuilderSAH;
  }
  this->BVH8InstanceSceneBuilderSAH = pcVar1;
  this->BVH8InstanceMBSceneBuilderSAH = pcVar2;
  this->BVH8InstanceArraySceneBuilderSAH = pcVar3;
  pcVar1 = BVH8InstanceArrayMBSceneBuilderSAH_error;
  if (bVar4) {
    pcVar1 = avx::BVH8InstanceArrayMBSceneBuilderSAH;
  }
  this->BVH8InstanceArrayMBSceneBuilderSAH = pcVar1;
  pcVar1 = BVH8GridSceneBuilderSAH_error;
  if (bVar4) {
    pcVar1 = avx::BVH8GridSceneBuilderSAH;
  }
  pcVar2 = BVH8GridMBSceneBuilderSAH_error;
  if (bVar4) {
    pcVar2 = avx::BVH8GridMBSceneBuilderSAH;
  }
  pcVar3 = BVH8Triangle4SceneBuilderFastSpatialSAH_error;
  if (bVar4) {
    pcVar3 = avx::BVH8Triangle4SceneBuilderFastSpatialSAH;
  }
  this->BVH8GridSceneBuilderSAH = pcVar1;
  this->BVH8GridMBSceneBuilderSAH = pcVar2;
  this->BVH8Triangle4SceneBuilderFastSpatialSAH = pcVar3;
  pcVar1 = BVH8Triangle4vSceneBuilderFastSpatialSAH_error;
  if (bVar4) {
    pcVar1 = avx::BVH8Triangle4vSceneBuilderFastSpatialSAH;
  }
  this->BVH8Triangle4vSceneBuilderFastSpatialSAH = pcVar1;
  pcVar1 = BVH8Quad4vSceneBuilderFastSpatialSAH_error;
  if (bVar4) {
    pcVar1 = avx::BVH8Quad4vSceneBuilderFastSpatialSAH;
  }
  pcVar2 = BVH8BuilderTwoLevelTriangle4MeshSAH_error;
  if (bVar4) {
    pcVar2 = avx::BVH8BuilderTwoLevelTriangle4MeshSAH;
  }
  pcVar3 = BVH8BuilderTwoLevelTriangle4vMeshSAH_error;
  if (bVar4) {
    pcVar3 = avx::BVH8BuilderTwoLevelTriangle4vMeshSAH;
  }
  this->BVH8Quad4vSceneBuilderFastSpatialSAH = pcVar1;
  this->BVH8BuilderTwoLevelTriangle4MeshSAH = pcVar2;
  this->BVH8BuilderTwoLevelTriangle4vMeshSAH = pcVar3;
  pcVar1 = BVH8BuilderTwoLevelTriangle4iMeshSAH_error;
  if (bVar4) {
    pcVar1 = avx::BVH8BuilderTwoLevelTriangle4iMeshSAH;
  }
  this->BVH8BuilderTwoLevelTriangle4iMeshSAH = pcVar1;
  pcVar1 = BVH8BuilderTwoLevelQuadMeshSAH_error;
  if (bVar4) {
    pcVar1 = avx::BVH8BuilderTwoLevelQuadMeshSAH;
  }
  pcVar2 = BVH8BuilderTwoLevelVirtualSAH_error;
  if (bVar4) {
    pcVar2 = avx::BVH8BuilderTwoLevelVirtualSAH;
  }
  pcVar3 = BVH8BuilderTwoLevelInstanceSAH_error;
  if (bVar4) {
    pcVar3 = avx::BVH8BuilderTwoLevelInstanceSAH;
  }
  this->BVH8BuilderTwoLevelQuadMeshSAH = pcVar1;
  this->BVH8BuilderTwoLevelVirtualSAH = pcVar2;
  this->BVH8BuilderTwoLevelInstanceSAH = pcVar3;
  pcVar1 = BVH8BuilderTwoLevelInstanceArraySAH_error;
  if (bVar4) {
    pcVar1 = avx::BVH8BuilderTwoLevelInstanceArraySAH;
  }
  this->BVH8BuilderTwoLevelInstanceArraySAH = pcVar1;
  return;
}

Assistant:

void BVH8Factory::selectBuilders(int features)
  {
    IF_ENABLED_CURVES_OR_POINTS(SELECT_SYMBOL_INIT_AVX(features,BVH8Curve8vBuilder_OBB_New));
    IF_ENABLED_CURVES_OR_POINTS(SELECT_SYMBOL_INIT_AVX(features,BVH8OBBCurve8iMBBuilder_OBB));

    IF_ENABLED_TRIS(SELECT_SYMBOL_INIT_AVX(features,BVH8Triangle4SceneBuilderSAH));
    IF_ENABLED_TRIS(SELECT_SYMBOL_INIT_AVX(features,BVH8Triangle4vSceneBuilderSAH));
    IF_ENABLED_TRIS(SELECT_SYMBOL_INIT_AVX(features,BVH8Triangle4iSceneBuilderSAH));
    IF_ENABLED_TRIS(SELECT_SYMBOL_INIT_AVX(features,BVH8Triangle4iMBSceneBuilderSAH));
    IF_ENABLED_TRIS(SELECT_SYMBOL_INIT_AVX(features,BVH8Triangle4vMBSceneBuilderSAH));
    IF_ENABLED_TRIS(SELECT_SYMBOL_INIT_AVX(features,BVH8QuantizedTriangle4iSceneBuilderSAH));
    IF_ENABLED_TRIS(SELECT_SYMBOL_INIT_AVX(features,BVH8QuantizedTriangle4SceneBuilderSAH));

    IF_ENABLED_QUADS(SELECT_SYMBOL_INIT_AVX(features,BVH8Quad4vSceneBuilderSAH));
    IF_ENABLED_QUADS(SELECT_SYMBOL_INIT_AVX(features,BVH8Quad4iSceneBuilderSAH));
    IF_ENABLED_QUADS(SELECT_SYMBOL_INIT_AVX(features,BVH8Quad4iMBSceneBuilderSAH));
    IF_ENABLED_QUADS(SELECT_SYMBOL_INIT_AVX(features,BVH8QuantizedQuad4iSceneBuilderSAH));

    IF_ENABLED_USER(SELECT_SYMBOL_INIT_AVX(features,BVH8VirtualSceneBuilderSAH));
    IF_ENABLED_USER(SELECT_SYMBOL_INIT_AVX(features,BVH8VirtualMBSceneBuilderSAH));

    IF_ENABLED_INSTANCE(SELECT_SYMBOL_INIT_AVX(features,BVH8InstanceSceneBuilderSAH));
    IF_ENABLED_INSTANCE(SELECT_SYMBOL_INIT_AVX(features,BVH8InstanceMBSceneBuilderSAH));

    IF_ENABLED_INSTANCE_ARRAY(SELECT_SYMBOL_INIT_AVX(features,BVH8InstanceArraySceneBuilderSAH));
    IF_ENABLED_INSTANCE_ARRAY(SELECT_SYMBOL_INIT_AVX(features,BVH8InstanceArrayMBSceneBuilderSAH));
    
    IF_ENABLED_GRIDS(SELECT_SYMBOL_INIT_AVX(features,BVH8GridSceneBuilderSAH));
    IF_ENABLED_GRIDS(SELECT_SYMBOL_INIT_AVX(features,BVH8GridMBSceneBuilderSAH));

    IF_ENABLED_TRIS(SELECT_SYMBOL_INIT_AVX(features,BVH8Triangle4SceneBuilderFastSpatialSAH));
    IF_ENABLED_TRIS(SELECT_SYMBOL_INIT_AVX(features,BVH8Triangle4vSceneBuilderFastSpatialSAH));
    IF_ENABLED_QUADS(SELECT_SYMBOL_INIT_AVX(features,BVH8Quad4vSceneBuilderFastSpatialSAH));

    IF_ENABLED_TRIS  (SELECT_SYMBOL_INIT_AVX(features,BVH8BuilderTwoLevelTriangle4MeshSAH));
    IF_ENABLED_TRIS  (SELECT_SYMBOL_INIT_AVX(features,BVH8BuilderTwoLevelTriangle4vMeshSAH));
    IF_ENABLED_TRIS  (SELECT_SYMBOL_INIT_AVX(features,BVH8BuilderTwoLevelTriangle4iMeshSAH));
    IF_ENABLED_QUADS (SELECT_SYMBOL_INIT_AVX(features,BVH8BuilderTwoLevelQuadMeshSAH));
    IF_ENABLED_USER  (SELECT_SYMBOL_INIT_AVX(features,BVH8BuilderTwoLevelVirtualSAH));
    IF_ENABLED_INSTANCE (SELECT_SYMBOL_INIT_AVX(features,BVH8BuilderTwoLevelInstanceSAH));
    IF_ENABLED_INSTANCE_ARRAY (SELECT_SYMBOL_INIT_AVX(features,BVH8BuilderTwoLevelInstanceArraySAH));
  }